

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ElemStack::addGlobalPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  uint uVar1;
  StackElem *this_00;
  uint prefId;
  uint uriId_local;
  XMLCh *prefixToAdd_local;
  ElemStack *this_local;
  
  if (this->fGlobalNamespaces == (StackElem *)0x0) {
    this_00 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    StackElem::StackElem(this_00);
    this->fGlobalNamespaces = this_00;
    this->fGlobalNamespaces->fChildCapacity = 0;
    this->fGlobalNamespaces->fChildren = (QName **)0x0;
    this->fGlobalNamespaces->fMapCapacity = 0;
    this->fGlobalNamespaces->fMap = (PrefMapElem *)0x0;
    this->fGlobalNamespaces->fMapCount = 0;
    this->fGlobalNamespaces->fSchemaElemName = (XMLCh *)0x0;
    this->fGlobalNamespaces->fSchemaElemNameMaxLen = 0;
    this->fGlobalNamespaces->fThisElement = (XMLElementDecl *)0x0;
    this->fGlobalNamespaces->fReaderNum = 0xffffffff;
    this->fGlobalNamespaces->fChildCount = 0;
    this->fGlobalNamespaces->fValidationFlag = false;
    this->fGlobalNamespaces->fCommentOrPISeen = false;
    this->fGlobalNamespaces->fReferenceEscaped = false;
    this->fGlobalNamespaces->fCurrentURI = this->fUnknownNamespaceId;
    this->fGlobalNamespaces->fCurrentScope = 0xfffffffe;
    this->fGlobalNamespaces->fCurrentGrammar = (Grammar *)0x0;
  }
  uVar1 = XMLStringPool::addOrFind(&this->fPrefixPool,prefixToAdd);
  if (this->fGlobalNamespaces->fMapCount == this->fGlobalNamespaces->fMapCapacity) {
    expandMap(this,this->fGlobalNamespaces);
  }
  this->fGlobalNamespaces->fMap[this->fGlobalNamespaces->fMapCount].fPrefId = uVar1;
  if ((uVar1 == this->fGlobalPoolId) && (uriId == this->fEmptyNamespaceId)) {
    this->fGlobalNamespaces->fMap[this->fGlobalNamespaces->fMapCount].fURIId =
         this->fEmptyNamespaceId;
  }
  else {
    this->fGlobalNamespaces->fMap[this->fGlobalNamespaces->fMapCount].fURIId = uriId;
  }
  this->fGlobalNamespaces->fMapCount = this->fGlobalNamespaces->fMapCount + 1;
  return;
}

Assistant:

void ElemStack::addGlobalPrefix(const XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fGlobalNamespaces)
    {
        fGlobalNamespaces = new (fMemoryManager) StackElem;
        fGlobalNamespaces->fChildCapacity = 0;
        fGlobalNamespaces->fChildren = 0;
        fGlobalNamespaces->fMapCapacity = 0;
        fGlobalNamespaces->fMap = 0;
        fGlobalNamespaces->fMapCount = 0;
        fGlobalNamespaces->fSchemaElemName = 0;
        fGlobalNamespaces->fSchemaElemNameMaxLen = 0;
        fGlobalNamespaces->fThisElement = 0;
        fGlobalNamespaces->fReaderNum = 0xFFFFFFFF;
        fGlobalNamespaces->fChildCount = 0;
        fGlobalNamespaces->fValidationFlag = false;
        fGlobalNamespaces->fCommentOrPISeen = false;
        fGlobalNamespaces->fReferenceEscaped = false;
        fGlobalNamespaces->fCurrentURI = fUnknownNamespaceId;
        fGlobalNamespaces->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
        fGlobalNamespaces->fCurrentGrammar = 0;
    }

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (fGlobalNamespaces->fMapCount == fGlobalNamespaces->fMapCapacity)
        expandMap(fGlobalNamespaces);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = fEmptyNamespaceId;
    else
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = uriId;

    // Bump the map count now
    fGlobalNamespaces->fMapCount++;
}